

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O3

matches * mergematches(match a,matches *b)

{
  int iVar1;
  easm_expr *peVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  matches *pmVar7;
  reloc *prVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  match *__src;
  long lVar13;
  bool bVar14;
  match *local_118;
  int local_e8 [2];
  ulong auStack_e0 [21];
  int local_38;
  
  pmVar7 = (matches *)calloc(0x10,1);
  iVar4 = a.nrelocs;
  iVar3 = a.oplen;
  iVar6 = b->mnum;
  if (0 < iVar6) {
    uVar12 = (ulong)(uint)a.nrelocs;
    local_118 = (match *)0x0;
    iVar1 = 0;
    iVar11 = 0;
    lVar13 = 0;
    do {
      __src = b->m + lVar13;
      lVar10 = 0;
      bVar14 = true;
      do {
        bVar5 = bVar14;
        if ((__src->m[lVar10] & a.m[lVar10] & (__src->a[lVar10] ^ a.a[lVar10])) != 0)
        goto LAB_00245503;
        lVar10 = 1;
        bVar14 = false;
      } while (bVar5);
      memcpy(local_e8,__src,0xb8);
      if (local_e8[0] == 0) {
        local_e8[0] = iVar3;
      }
      lVar10 = 0;
      bVar14 = true;
      do {
        bVar5 = bVar14;
        auStack_e0[lVar10] = auStack_e0[lVar10] | a.a[lVar10];
        auStack_e0[lVar10 + 2] = auStack_e0[lVar10 + 2] | a.m[lVar10];
        lVar10 = 1;
        bVar14 = false;
      } while (bVar5);
      iVar6 = local_38 + iVar4;
      if (8 < iVar6) {
        __assert_fail("a.nrelocs + nm.nrelocs <= 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/envydis/core-as.c"
                      ,0x4c,"struct matches *mergematches(struct match, struct matches *)");
      }
      if (0 < iVar4) {
        uVar9 = 0;
        prVar8 = a.relocs;
        do {
          lVar10 = (long)local_38;
          peVar2 = prVar8->expr;
          auStack_e0[(lVar10 + uVar9) * 2 + 5] = (ulong)prVar8->bf;
          auStack_e0[(lVar10 + uVar9) * 2 + 6] = (ulong)peVar2;
          uVar9 = uVar9 + 1;
          prVar8 = prVar8 + 1;
        } while (uVar12 != uVar9);
        iVar6 = local_38 + iVar4;
      }
      local_38 = iVar6;
      if (iVar1 <= iVar11) {
        bVar14 = iVar1 == 0;
        iVar1 = iVar1 * 2;
        if (bVar14) {
          iVar1 = 0x10;
        }
        pmVar7->mmax = iVar1;
        local_118 = (match *)realloc(local_118,(long)iVar1 * 0xb8);
        pmVar7->m = local_118;
      }
      pmVar7->mnum = iVar11 + 1;
      memcpy(local_118 + iVar11,local_e8,0xb8);
      iVar6 = b->mnum;
      iVar11 = iVar11 + 1;
LAB_00245503:
      lVar13 = lVar13 + 1;
    } while (lVar13 < iVar6);
  }
  free(b->m);
  free(b);
  return pmVar7;
}

Assistant:

struct matches *mergematches(struct match a, struct matches *b) {
	struct matches *res = emptymatches();
	int i, j;
	for (i = 0; i < b->mnum; i++) {
		for (j = 0; j < MAXOPLEN; j++) {
			ull cmask = a.m[j] & b->m[i].m[j];
			if ((a.a[j] & cmask) != (b->m[i].a[j] & cmask))
				break;
		}
		if (j == MAXOPLEN) {
			struct match nm = b->m[i];
			if (!nm.oplen)
				nm.oplen = a.oplen;
			for (j = 0; j < MAXOPLEN; j++) {
				nm.a[j] |= a.a[j];
				nm.m[j] |= a.m[j];
			}
			int j;
			assert (a.nrelocs + nm.nrelocs <= 8);
			for (j = 0; j < a.nrelocs; j++)
				nm.relocs[nm.nrelocs + j] = a.relocs[j];
			nm.nrelocs += a.nrelocs;
			ADDARRAY(res->m, nm);
		}
	}
	free(b->m);
	free(b);
	return res;
}